

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyformat.h
# Opt level: O0

string * tinyformat::format<unsigned_long,unsigned_long,unsigned_long,long>
                   (char *fmt,unsigned_long *args,unsigned_long *args_1,unsigned_long *args_2,
                   long *args_3)

{
  string *in_RDI;
  ostream *in_R8;
  char *in_R9;
  long in_FS_OFFSET;
  ostringstream oss;
  ostringstream *this;
  unsigned_long *in_stack_fffffffffffffe40;
  unsigned_long *in_stack_fffffffffffffe48;
  ostringstream local_180 [376];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = local_180;
  std::__cxx11::ostringstream::ostringstream(this);
  format<unsigned_long,unsigned_long,unsigned_long,long>
            (in_R8,in_R9,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,(unsigned_long *)this,
             (long *)in_RDI);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string format(const char* fmt, const Args&... args)
{
    std::ostringstream oss;
    format(oss, fmt, args...);
    return oss.str();
}